

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

xmlChar * xmlSchemaCollapseString(xmlChar *value)

{
  xmlChar *pxVar1;
  long lVar2;
  long lVar3;
  byte *pbVar4;
  byte bVar5;
  int len;
  ulong uVar6;
  byte *pbVar7;
  int iVar8;
  
  if (value == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  lVar3 = 0;
  pbVar7 = value;
  while ((uVar6 = (ulong)*pbVar7, uVar6 < 0x21 && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0))) {
    pbVar7 = pbVar7 + 1;
    lVar3 = lVar3 + -1;
  }
  len = 0;
  pbVar4 = pbVar7;
  do {
    if ((char)uVar6 == ' ') {
      uVar6 = (ulong)pbVar4[1];
      if ((uVar6 < 0x21) && ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)) break;
    }
    else {
      iVar8 = (int)uVar6;
      if (iVar8 - 9U < 2) break;
      if (iVar8 == 0) goto LAB_001a3e40;
      if (iVar8 == 0xd) break;
      uVar6 = (ulong)pbVar4[1];
    }
    pbVar4 = pbVar4 + 1;
    len = len + 1;
  } while( true );
  iVar8 = ((int)lVar3 - (int)value) + (int)pbVar4;
  if (iVar8 == 0) {
LAB_001a3e40:
    lVar2 = -1;
    while (((pbVar7 < pbVar4 + lVar2 && (uVar6 = (ulong)pbVar4[lVar2], uVar6 < 0x21)) &&
           ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0))) {
      lVar2 = lVar2 + -1;
      len = len + -1;
    }
    if (lVar3 != 0 || lVar2 != -1) {
      pxVar1 = xmlStrndup(pbVar7,len);
      return pxVar1;
    }
  }
  else {
    pxVar1 = xmlStrdup(pbVar7);
    if (pxVar1 != (xmlChar *)0x0) {
      pbVar4 = pxVar1 + iVar8;
      pbVar7 = pbVar4;
      while( true ) {
        bVar5 = *pbVar4;
        uVar6 = (ulong)bVar5;
        if (0x20 < uVar6) break;
        if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
          if (uVar6 == 0) {
            *pbVar7 = 0;
            return pxVar1;
          }
          break;
        }
        do {
          pbVar4 = pbVar4 + 1;
          uVar6 = (ulong)*pbVar4;
          if (0x20 < uVar6) goto LAB_001a3e2b;
        } while ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0);
        if (uVar6 != 0) {
LAB_001a3e2b:
          bVar5 = 0x20;
LAB_001a3e38:
          *pbVar7 = bVar5;
          pbVar7 = pbVar7 + 1;
        }
      }
      pbVar4 = pbVar4 + 1;
      goto LAB_001a3e38;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSchemaCollapseString(const xmlChar *value) {
    const xmlChar *start = value, *end, *f;
    xmlChar *g;
    int col = 0;

    if (value == NULL) return(NULL);
    while ((*start != 0) && (IS_BLANK_CH(*start))) start++;
    end = start;
    while (*end != 0) {
	if ((*end == ' ') && (IS_BLANK_CH(end[1]))) {
	    col = end - start;
	    break;
	} else if ((*end == 0xa) || (*end == 0x9) || (*end == 0xd)) {
	    col = end - start;
	    break;
	}
	end++;
    }
    if (col == 0) {
	f = end;
	end--;
	while ((end > start) && (IS_BLANK_CH(*end))) end--;
	end++;
	if ((start == value) && (f == end)) return(NULL);
	return(xmlStrndup(start, end - start));
    }
    start = xmlStrdup(start);
    if (start == NULL) return(NULL);
    g = (xmlChar *) (start + col);
    end = g;
    while (*end != 0) {
	if (IS_BLANK_CH(*end)) {
	    end++;
	    while (IS_BLANK_CH(*end)) end++;
	    if (*end != 0)
		*g++ = ' ';
	} else
	    *g++ = *end++;
    }
    *g = 0;
    return((xmlChar *) start);
}